

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::ParseGoogleTestFlagsOnlyImpl<char>(int *argc,char **argv)

{
  int iVar1;
  char *str;
  bool bVar2;
  long lVar3;
  int *str_00;
  int iVar4;
  String arg_string;
  String local_40;
  
  str_00 = argc;
  if (1 < *argc) {
    iVar4 = 1;
    do {
      StreamableToString<char*>((internal *)&local_40,argv + iVar4);
      str = local_40.c_str_;
      bVar2 = ParseBoolFlag(local_40.c_str_,"also_run_disabled_tests",
                            (bool *)&FLAGS_gtest_also_run_disabled_tests);
      if (((((bVar2) ||
            (bVar2 = ParseBoolFlag(str,"break_on_failure",(bool *)&FLAGS_gtest_break_on_failure),
            bVar2)) ||
           (bVar2 = ParseBoolFlag(str,"catch_exceptions",(bool *)&FLAGS_gtest_catch_exceptions),
           bVar2)) ||
          (((bVar2 = ParseStringFlag(str,"color",(String *)&FLAGS_gtest_color), bVar2 ||
            (bVar2 = ParseStringFlag(str,"death_test_style",(String *)&FLAGS_gtest_death_test_style)
            , bVar2)) ||
           ((bVar2 = ParseBoolFlag(str,"death_test_use_fork",
                                   (bool *)&FLAGS_gtest_death_test_use_fork), bVar2 ||
            ((bVar2 = ParseStringFlag(str,"filter",(String *)&FLAGS_gtest_filter), bVar2 ||
             (bVar2 = ParseStringFlag(str,"internal_run_death_test",
                                      (String *)&FLAGS_gtest_internal_run_death_test), bVar2))))))))
         || ((bVar2 = ParseBoolFlag(str,"list_tests",(bool *)&FLAGS_gtest_list_tests), bVar2 ||
             (((((bVar2 = ParseStringFlag(str,"output",(String *)&FLAGS_gtest_output), bVar2 ||
                 (bVar2 = ParseBoolFlag(str,"print_time",(bool *)&FLAGS_gtest_print_time), bVar2))
                || (bVar2 = ParseInt32Flag(str,"random_seed",&FLAGS_gtest_random_seed), bVar2)) ||
               ((bVar2 = ParseInt32Flag(str,"repeat",&FLAGS_gtest_repeat), bVar2 ||
                (bVar2 = ParseBoolFlag(str,"shuffle",(bool *)&FLAGS_gtest_shuffle), bVar2)))) ||
              ((bVar2 = ParseInt32Flag(str,"stack_trace_depth",&FLAGS_gtest_stack_trace_depth),
               bVar2 || ((bVar2 = ParseStringFlag(str,"stream_result_to",
                                                  (String *)&FLAGS_gtest_stream_result_to), bVar2 ||
                         (bVar2 = ParseBoolFlag(str,"throw_on_failure",
                                                (bool *)&FLAGS_gtest_throw_on_failure), bVar2)))))))
             ))) {
        iVar1 = *argc;
        if (iVar1 != iVar4) {
          lVar3 = 0;
          do {
            argv[iVar4 + lVar3] = argv[(long)iVar4 + lVar3 + 1];
            lVar3 = lVar3 + 1;
          } while (iVar1 - iVar4 != (int)lVar3);
        }
        *argc = iVar1 + -1;
        iVar4 = iVar4 + -1;
      }
      else {
        bVar2 = String::operator==(&local_40,"--help");
        if ((((bVar2) || (bVar2 = String::operator==(&local_40,"-h"), bVar2)) ||
            (bVar2 = String::operator==(&local_40,"-?"), bVar2)) ||
           ((bVar2 = String::operator==(&local_40,"/?"), bVar2 ||
            (bVar2 = HasGoogleTestFlagPrefix((char *)0x16ccd0), bVar2)))) {
          g_help_flag = '\x01';
        }
      }
      str_00 = (int *)local_40.c_str_;
      if ((int *)local_40.c_str_ != (int *)0x0) {
        operator_delete__(local_40.c_str_);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < *argc);
  }
  if (g_help_flag != '\0') {
    PrintColorEncoded((char *)str_00);
  }
  return;
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  for (int i = 1; i < *argc; i++) {
    const String arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseBoolFlag;
    using internal::ParseInt32Flag;
    using internal::ParseStringFlag;

    // Do we see a Google Test flag?
    if (ParseBoolFlag(arg, kAlsoRunDisabledTestsFlag,
                      &GTEST_FLAG(also_run_disabled_tests)) ||
        ParseBoolFlag(arg, kBreakOnFailureFlag,
                      &GTEST_FLAG(break_on_failure)) ||
        ParseBoolFlag(arg, kCatchExceptionsFlag,
                      &GTEST_FLAG(catch_exceptions)) ||
        ParseStringFlag(arg, kColorFlag, &GTEST_FLAG(color)) ||
        ParseStringFlag(arg, kDeathTestStyleFlag,
                        &GTEST_FLAG(death_test_style)) ||
        ParseBoolFlag(arg, kDeathTestUseFork,
                      &GTEST_FLAG(death_test_use_fork)) ||
        ParseStringFlag(arg, kFilterFlag, &GTEST_FLAG(filter)) ||
        ParseStringFlag(arg, kInternalRunDeathTestFlag,
                        &GTEST_FLAG(internal_run_death_test)) ||
        ParseBoolFlag(arg, kListTestsFlag, &GTEST_FLAG(list_tests)) ||
        ParseStringFlag(arg, kOutputFlag, &GTEST_FLAG(output)) ||
        ParseBoolFlag(arg, kPrintTimeFlag, &GTEST_FLAG(print_time)) ||
        ParseInt32Flag(arg, kRandomSeedFlag, &GTEST_FLAG(random_seed)) ||
        ParseInt32Flag(arg, kRepeatFlag, &GTEST_FLAG(repeat)) ||
        ParseBoolFlag(arg, kShuffleFlag, &GTEST_FLAG(shuffle)) ||
        ParseInt32Flag(arg, kStackTraceDepthFlag,
                       &GTEST_FLAG(stack_trace_depth)) ||
        ParseStringFlag(arg, kStreamResultToFlag,
                        &GTEST_FLAG(stream_result_to)) ||
        ParseBoolFlag(arg, kThrowOnFailureFlag,
                      &GTEST_FLAG(throw_on_failure))
        ) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    } else if (arg_string == "--help" || arg_string == "-h" ||
               arg_string == "-?" || arg_string == "/?" ||
               HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}